

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O3

void target_add_ret_ops(c2m_ctx_t c2m_ctx,type *ret_type,op_t res)

{
  int64_t *piVar1;
  ulong uVar2;
  anon_union_32_12_57d33f68_for_u *paVar3;
  MIR_type_t type;
  gen_ctx_conflict *pgVar4;
  VARR_MIR_op_t *pVVar5;
  MIR_item_t pMVar6;
  VARR_MIR_proto_t *pVVar7;
  int64_t iVar8;
  VARR_uint8_t *pVVar9;
  VARR_uint8_t *pVVar10;
  VARR_uint8_t *pVVar11;
  HTAB_MIR_item_t *pHVar12;
  MIR_op_t op;
  MIR_op_t op_00;
  MIR_op_t op_01;
  op_t var;
  uint uVar13;
  MIR_reg_t base;
  int iVar14;
  MIR_insn_t_conflict pMVar15;
  void *pvVar16;
  mir_size_t size;
  MIR_op_t *pMVar17;
  size_t sVar18;
  type *ptVar19;
  ulong uVar20;
  MIR_context_t pMVar21;
  DLIST_LINK_MIR_item_t *pDVar22;
  MIR_type_t t;
  node_t_conflict pnVar23;
  long lVar24;
  MIR_context_t func_item;
  MIR_context_t insn;
  c2m_ctx_t pcVar25;
  c2m_ctx_t pcVar26;
  MIR_insn_code_t code;
  decl_t *unaff_R13;
  MIR_type_t *qword_types_00;
  op_t temp;
  MIR_type_t qword_types [2];
  undefined1 in_stack_fffffffffffffde0 [12];
  int in_stack_fffffffffffffdec;
  __jmp_buf_tag *list;
  undefined1 local_128 [16];
  decl_t pdStack_118;
  char *pcStack_110;
  anon_union_32_12_57d33f68_for_u aStack_108;
  decl_t local_e8;
  decl_t pdStack_e0;
  decl_t pdStack_d8;
  char *pcStack_d0;
  decl_t pdStack_c8;
  char *pcStack_c0;
  decl_t pdStack_b8;
  char *pcStack_b0;
  MIR_type_t local_a0 [2];
  MIR_op_t local_98;
  undefined1 local_68 [16];
  anon_union_32_12_57d33f68_for_u aStack_58;
  
  pgVar4 = c2m_ctx->gen_ctx;
  pcVar26 = (c2m_ctx_t)c2m_ctx->ctx;
  if ((ret_type->mode == TM_BASIC) && ((ret_type->u).basic_type == TP_VOID)) {
    return;
  }
  qword_types_00 = local_a0;
  func_item = (MIR_context_t)ret_type;
  pcVar25 = c2m_ctx;
  uVar13 = process_ret_type(c2m_ctx,ret_type,qword_types_00);
  if (uVar13 == 0) {
    if ((ret_type->mode & ~TM_BASIC) == TM_STRUCT) {
      base = MIR_reg((MIR_context_t)pcVar26,"Ret_Addr",(pgVar4->curr_func->u).func);
      MIR_new_mem_op((MIR_op_t *)local_68,(MIR_context_t)pcVar26,MIR_T_I8,0,base,0,'\x01');
      local_e8 = (decl_t)0x0;
      aStack_108._8_8_ = aStack_58._16_8_;
      aStack_108._16_8_ = aStack_58.mem.disp;
      local_128._8_8_ = local_68._0_8_;
      pdStack_118 = (decl_t)local_68._8_8_;
      pcStack_110 = (char *)aStack_58.i;
      aStack_108.i = aStack_58._8_8_;
      pdStack_e0 = (decl_t)local_128._0_8_;
      pdStack_d8 = (decl_t)local_68._0_8_;
      pcStack_d0 = (char *)local_68._8_8_;
      pdStack_c8 = (decl_t)aStack_58.i;
      pcStack_c0 = aStack_58.str.s;
      pdStack_b8 = (decl_t)aStack_58._16_8_;
      pcStack_b0 = (char *)aStack_58.mem.disp;
      size = raw_type_size(c2m_ctx,ret_type);
      uVar20 = (ulong)ret_type->align;
      if (uVar20 != 0) {
        uVar2 = (size - 1) + uVar20;
        size = uVar2 - uVar2 % uVar20;
      }
      var._8_8_ = pdStack_e0;
      var.decl = local_e8;
      var.mir_op.data = pdStack_d8;
      var.mir_op._8_8_ = pcStack_d0;
      var.mir_op.u.i = (int64_t)pdStack_c8;
      var.mir_op.u.str.s = pcStack_c0;
      var.mir_op.u._16_8_ = pdStack_b8;
      var.mir_op.u.mem.disp = (MIR_disp_t)pcStack_b0;
      block_move(c2m_ctx,var,res,size);
      return;
    }
    pdStack_d8 = res.mir_op.u._0_8_;
    pdStack_c8 = res.mir_op.u._16_8_;
    pVVar5 = pgVar4->ret_ops;
    pcStack_c0 = (char *)res.mir_op.u.mem.disp;
    local_e8 = (decl_t)res.mir_op.data;
    pdStack_e0 = (decl_t)res.mir_op._8_8_;
    pcStack_d0 = res.mir_op.u.str.s;
    pMVar17 = pVVar5->varr;
    if (pMVar17 != (MIR_op_t *)0x0) {
      sVar18 = pVVar5->els_num;
      uVar20 = sVar18 + 1;
      if (pVVar5->size < uVar20) {
        sVar18 = (uVar20 >> 1) + uVar20;
        pMVar17 = (MIR_op_t *)realloc(pMVar17,sVar18 * 0x30);
        pVVar5->varr = pMVar17;
        pVVar5->size = sVar18;
        sVar18 = pVVar5->els_num;
        uVar20 = sVar18 + 1;
      }
      pVVar5->els_num = uVar20;
      paVar3 = &pMVar17[sVar18].u;
      paVar3->i = (int64_t)pdStack_d8;
      (&paVar3->i)[1] = (int64_t)pcStack_d0;
      (&paVar3->i)[2] = (int64_t)pdStack_c8;
      (&paVar3->i)[3] = (int64_t)pcStack_c0;
      pMVar17 = pMVar17 + sVar18;
      pMVar17->data = local_e8;
      *(decl_t *)&pMVar17->field_0x8 = pdStack_e0;
      (pMVar17->u).i = (int64_t)pdStack_d8;
      (pMVar17->u).str.s = pcStack_d0;
      return;
    }
  }
  else {
    if ((int)uVar13 < 1) {
      return;
    }
    unaff_R13 = &pdStack_d8;
    lVar24 = 0;
    while( true ) {
      type = *qword_types_00;
      t = type;
      if ((type & ~MIR_T_I16) == MIR_T_U8) {
        t = MIR_T_U32;
      }
      if ((type & ~MIR_T_I16) == MIR_T_I8) {
        t = MIR_T_I32;
      }
      get_new_temp((op_t *)local_128,c2m_ctx,t);
      local_e8 = (decl_t)local_128._0_8_;
      pdStack_e0 = (decl_t)local_128._8_8_;
      pdStack_d8 = pdStack_118;
      pcStack_d0 = pcStack_110;
      pdStack_c8 = (decl_t)aStack_108.i;
      pcStack_c0 = aStack_108.str.s;
      pdStack_b8 = (decl_t)aStack_108._16_8_;
      pcStack_b0 = (char *)aStack_108.mem.disp;
      if (type == MIR_T_F) {
        code = MIR_FMOV;
      }
      else if (type == MIR_T_D) {
        code = MIR_DMOV;
      }
      else {
        code = (uint)(type == MIR_T_LD) * 3;
      }
      MIR_new_mem_op(&local_98,(MIR_context_t)pcVar26,type,res.mir_op.u.mem.disp + lVar24,
                     res.mir_op.u.mem.base,res.mir_op.u.mem.index,res.mir_op.u.mem.scale);
      pMVar15 = MIR_new_insn((MIR_context_t)pcVar26,code);
      func_item = (MIR_context_t)pgVar4->curr_func;
      pcVar25 = pcVar26;
      MIR_append_insn((MIR_context_t)pcVar26,(MIR_item_t_conflict)func_item,pMVar15);
      ret_type = (type *)pgVar4->ret_ops;
      aStack_108.i = (int64_t)pdStack_b8;
      aStack_108.str.s = pcStack_b0;
      local_128._0_8_ = pdStack_d8;
      local_128._8_8_ = pcStack_d0;
      pdStack_118 = pdStack_c8;
      pcStack_110 = pcStack_c0;
      pvVar16 = *(void **)&ret_type->antialias;
      if (pvVar16 == (void *)0x0) break;
      pnVar23 = ret_type->pos_node;
      ptVar19 = (type *)((long)&pnVar23->code + 1);
      if (ret_type->arr_type < ptVar19) {
        ptVar19 = (type *)((long)&ptVar19->pos_node + ((ulong)ptVar19 >> 1));
        pvVar16 = realloc(pvVar16,(long)ptVar19 * 0x30);
        *(void **)&ret_type->antialias = pvVar16;
        ret_type->arr_type = ptVar19;
        pnVar23 = ret_type->pos_node;
        ptVar19 = (type *)((long)&pnVar23->code + 1);
      }
      ret_type->pos_node = (node_t_conflict)ptVar19;
      qword_types_00 = qword_types_00 + 1;
      lVar24 = lVar24 + 8;
      piVar1 = (int64_t *)((long)pvVar16 + (long)pnVar23 * 0x30 + 0x10);
      *piVar1 = (int64_t)pdStack_118;
      piVar1[1] = (int64_t)pcStack_110;
      piVar1[2] = aStack_108.i;
      piVar1[3] = (int64_t)aStack_108.str.s;
      piVar1 = (int64_t *)((long)pvVar16 + (long)pnVar23 * 0x30);
      *piVar1 = local_128._0_8_;
      piVar1[1] = local_128._8_8_;
      piVar1[2] = (int64_t)pdStack_118;
      piVar1[3] = (int64_t)pcStack_110;
      if ((ulong)uVar13 << 3 == lVar24) {
        return;
      }
    }
    target_add_ret_ops_cold_1();
  }
  target_add_ret_ops_cold_2();
  list = pcVar25->env;
  insn = func_item;
  pcVar26 = (c2m_ctx_t)list;
  DLIST_MIR_item_t_remove((DLIST_MIR_item_t *)list,(MIR_item_t)func_item);
  if (func_item == (MIR_context_t)0x0) {
    move_item_to_module_start_cold_3();
LAB_001aa28a:
    move_item_to_module_start_cold_1();
  }
  else {
    pMVar6 = (MIR_item_t)list->__jmpbuf[0];
    if (pMVar6 != (MIR_item_t)0x0) {
      if ((pMVar6->item_link).prev == (MIR_item_t)0x0) {
        pDVar22 = &pMVar6->item_link;
        goto LAB_001aa26d;
      }
      goto LAB_001aa28a;
    }
    if (pcVar25->env[0].__jmpbuf[1] == 0) {
      pDVar22 = (DLIST_LINK_MIR_item_t *)(pcVar25->env[0].__jmpbuf + 1);
LAB_001aa26d:
      pDVar22->prev = (MIR_item_t)func_item;
      ((DLIST_LINK_MIR_item_t *)&func_item->error_func)->prev = (MIR_item_t)0x0;
      *(MIR_item_t *)&func_item->func_redef_permission_p = pMVar6;
      list->__jmpbuf[0] = (long)func_item;
      return;
    }
  }
  move_item_to_module_start_cold_2();
  if ((pcVar26 != (c2m_ctx_t)0x0) && (insn != (MIR_context_t)0x0)) {
    pMVar6 = ((DLIST_LINK_MIR_item_t *)&insn->error_func)->prev;
    if (pMVar6 == (MIR_item_t)0x0) {
      if (pcVar26->ctx != insn) goto LAB_001aa2ec;
      pMVar21 = *(MIR_context_t *)&insn->func_redef_permission_p;
      pcVar26->ctx = pMVar21;
    }
    else {
      pMVar21 = *(MIR_context_t *)&insn->func_redef_permission_p;
      (pMVar6->item_link).next = (MIR_item_t)pMVar21;
    }
    if (pMVar21 == (MIR_context_t)0x0) {
      if ((MIR_context_t)pcVar26->options != insn) goto LAB_001aa2f1;
      pDVar22 = (DLIST_LINK_MIR_item_t *)&pcVar26->options;
    }
    else {
      pDVar22 = (DLIST_LINK_MIR_item_t *)&pMVar21->error_func;
    }
    pDVar22->prev = pMVar6;
    ((DLIST_LINK_MIR_item_t *)&insn->error_func)->prev = (MIR_item_t)0x0;
    *(MIR_item_t *)&insn->func_redef_permission_p = (MIR_item_t)0x0;
    return;
  }
  DLIST_MIR_item_t_remove_cold_1();
LAB_001aa2ec:
  DLIST_MIR_item_t_remove_cold_2();
LAB_001aa2f1:
  DLIST_MIR_item_t_remove_cold_3();
  pMVar21 = pcVar26->ctx;
  pgVar4 = pcVar26->gen_ctx;
  if ((((((insn->func_redef_permission_p & 0xfffffffcU) == 0) &&
        (pMVar15 = (((pgVar4->curr_func->u).func)->insns).tail, pMVar15 != (MIR_insn_t_conflict)0x0)
        ) && (sVar18 = MIR_insn_nops(pMVar21,pMVar15), sVar18 != 0)) &&
      ((op._12_4_ = in_stack_fffffffffffffdec, op._0_12_ = in_stack_fffffffffffffde0,
       op.u.ref = (MIR_item_t)func_item, op.u.str.s = (char *)ret_type, op.u._16_8_ = unaff_R13,
       op.u.mem.disp = (MIR_disp_t)list, iVar14 = temp_reg_p(pcVar26,op), iVar14 != 0 &&
       (op_00._12_4_ = in_stack_fffffffffffffdec, op_00._0_12_ = in_stack_fffffffffffffde0,
       op_00.u.ref = (MIR_item_t)func_item, op_00.u.str.s = (char *)ret_type,
       op_00.u._16_8_ = unaff_R13, op_00.u.mem.disp = (MIR_disp_t)list,
       iVar14 = temp_reg_p(pcVar26,op_00), iVar14 == 0)))) &&
     ((op_01._12_4_ = in_stack_fffffffffffffdec, op_01._0_12_ = in_stack_fffffffffffffde0,
      op_01.u.ref = (MIR_item_t)func_item, op_01.u.str.s = (char *)ret_type,
      op_01.u._16_8_ = unaff_R13, op_01.u.mem.disp = (MIR_disp_t)list,
      iVar14 = temp_reg_p(pcVar26,op_01), iVar14 != 0 &&
      ((*(MIR_reg_t *)&(insn->environment_module).items.head == pMVar15->ops[0].u.reg &&
       (MIR_insn_op_mode(pMVar21,pMVar15,0,(int *)&stack0xfffffffffffffdec),
       in_stack_fffffffffffffdec != 0)))))) {
    pvVar16 = ((MIR_op_t *)&insn->insn_nops)->data;
    pVVar7 = insn->unspec_protos;
    iVar8 = ((anon_union_32_12_57d33f68_for_u *)&insn->temp_string)->i;
    pVVar9 = insn->temp_data;
    pVVar10 = insn->temp_data;
    pVVar11 = insn->used_label_p;
    pHVar12 = insn->module_item_tab;
    pMVar15->ops[0].u.i = ((anon_union_32_12_57d33f68_for_u *)&insn->temp_string)->i;
    pMVar15->ops[0].u.str.s = (char *)pVVar10;
    *(VARR_uint8_t **)((long)&pMVar15->ops[0].u + 0x10) = pVVar11;
    pMVar15->ops[0].u.mem.disp = (MIR_disp_t)pHVar12;
    pMVar15->ops[0].data = pvVar16;
    *(VARR_MIR_proto_t **)&pMVar15->ops[0].field_0x8 = pVVar7;
    pMVar15->ops[0].u.i = iVar8;
    pMVar15->ops[0].u.str.s = (char *)pVVar9;
    MIR_append_insn(pMVar21,pgVar4->curr_func,(MIR_insn_t_conflict)insn);
    MIR_remove_insn(pMVar21,pgVar4->curr_func,(MIR_insn_t_conflict)insn);
  }
  else {
    MIR_append_insn(pMVar21,pgVar4->curr_func,(MIR_insn_t_conflict)insn);
  }
  return;
}

Assistant:

static void target_add_ret_ops (c2m_ctx_t c2m_ctx, struct type *ret_type, op_t res) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_type_t type;
  MIR_type_t qword_types[MAX_QWORDS];
  MIR_insn_t insn;
  MIR_reg_t ret_addr_reg;
  op_t temp, var;
  int i, n_qwords;

  if (void_type_p (ret_type)) return;
  n_qwords = process_ret_type (c2m_ctx, ret_type, qword_types);
  if (n_qwords != 0) {
    for (i = 0; i < n_qwords; i++) {
      type = qword_types[i];
      temp = get_new_temp (c2m_ctx, promote_mir_int_type (type));
      insn = MIR_new_insn (ctx, tp_mov (type), temp.mir_op,
                           MIR_new_mem_op (ctx, type, res.mir_op.u.mem.disp + 8 * i,
                                           res.mir_op.u.mem.base, res.mir_op.u.mem.index,
                                           res.mir_op.u.mem.scale));
      MIR_append_insn (ctx, curr_func, insn);
      VARR_PUSH (MIR_op_t, ret_ops, temp.mir_op);
    }
  } else if (ret_type->mode != TM_STRUCT && ret_type->mode != TM_UNION) {
    VARR_PUSH (MIR_op_t, ret_ops, res.mir_op);
  } else {
    ret_addr_reg = MIR_reg (ctx, RET_ADDR_NAME, curr_func->u.func);
    var = new_op (NULL, MIR_new_mem_op (ctx, MIR_T_I8, 0, ret_addr_reg, 0, 1));
    block_move (c2m_ctx, var, res, type_size (c2m_ctx, ret_type));
  }
}